

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffcmps(char *templt,char *colname,int casesen,int *match,int *exact)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ushort **ppuVar5;
  bool bVar6;
  char local_e8 [8];
  char col [71];
  char local_98 [8];
  char temp [71];
  int local_48;
  int ssave;
  int tsave;
  int wildsearch;
  int s1;
  int t1;
  int found;
  int ii;
  int *exact_local;
  int *match_local;
  int casesen_local;
  char *colname_local;
  char *templt_local;
  
  bVar1 = false;
  local_48 = 0;
  stack0xffffffffffffffb4 = 0;
  *match = 0;
  *exact = 1;
  strncpy(local_98,templt,0x47);
  strncpy(local_e8,colname,0x47);
  temp[0x3e] = '\0';
  col[0x3e] = '\0';
  sVar4 = strlen(local_98);
  t1 = (int)sVar4;
  while( true ) {
    t1 = t1 + -1;
    bVar6 = false;
    if (-1 < t1) {
      bVar6 = local_98[t1] == ' ';
    }
    if (!bVar6) break;
    local_98[t1] = '\0';
  }
  sVar4 = strlen(local_e8);
  t1 = (int)sVar4;
  while( true ) {
    t1 = t1 + -1;
    bVar6 = false;
    if (-1 < t1) {
      bVar6 = local_e8[t1] == ' ';
    }
    if (!bVar6) break;
    local_e8[t1] = '\0';
  }
  if (casesen == 0) {
    ffupch(local_98);
    ffupch(local_e8);
  }
  if (((local_98[0] < local_e8[0]) || (local_e8[0] < local_98[0])) ||
     (iVar3 = strcmp(local_98,local_e8), iVar3 != 0)) {
    *exact = 0;
    wildsearch = 0;
    tsave = 0;
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            if ((local_98[wildsearch] == '\0') && (local_e8[tsave] == '\0')) {
              *match = 1;
              return;
            }
            if (local_98[wildsearch] == '\0') {
              if (!bVar1) {
                return;
              }
              wildsearch = local_48;
              tsave = stack0xffffffffffffffb4 + 1;
            }
            else if (local_e8[tsave] == '\0') {
              if (local_98[wildsearch] != '*') {
                return;
              }
              if (local_98[wildsearch + 1] != '\0') {
                return;
              }
              *match = 1;
              return;
            }
            if ((local_98[wildsearch] != local_e8[tsave]) && (local_98[wildsearch] != '?')) break;
            tsave = tsave + 1;
            wildsearch = wildsearch + 1;
          }
          if ((local_98[wildsearch] != '#') ||
             (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)local_e8[tsave]] & 0x800) == 0)) break;
          wildsearch = wildsearch + 1;
          do {
            tsave = tsave + 1;
            ppuVar5 = __ctype_b_loc();
          } while (((*ppuVar5)[(int)local_e8[tsave]] & 0x800) != 0);
        }
        if (local_98[wildsearch] == '*') break;
        if (!bVar1) {
          return;
        }
        wildsearch = local_48;
        tsave = stack0xffffffffffffffb4 + 1;
      }
      bVar1 = true;
      local_48 = wildsearch;
      stack0xffffffffffffffb4 = tsave;
      wildsearch = wildsearch + 1;
      if ((local_98[wildsearch] == '\0') || (local_98[wildsearch] == ' ')) {
        *match = 1;
        return;
      }
      bVar6 = false;
      while( true ) {
        bVar2 = false;
        if (local_e8[tsave] != '\0') {
          bVar2 = (bool)(bVar6 ^ 1);
        }
        if (!bVar2) break;
        if (local_98[wildsearch] == local_e8[tsave]) {
          wildsearch = wildsearch + 1;
          bVar6 = true;
        }
        tsave = tsave + 1;
      }
    } while (bVar6);
  }
  else {
    *match = 1;
  }
  return;
}

Assistant:

void ffcmps(char *templt,   /* I - input template (may have wildcards)      */
            char *colname,  /* I - full column name up to 68 + 1 chars long */
            int  casesen,   /* I - case sensitive string comparison? 1=yes  */
            int  *match,    /* O - do template and colname match? 1=yes     */
            int  *exact)    /* O - do strings exactly match, or wildcards   */
/*
  compare the template to the string and test if they match.
  The strings are limited to 68 characters or less (the max. length
  of a FITS string keyword value.  This routine reports whether
  the two strings match and whether the match is exact or
  involves wildcards.

  This algorithm is very similar to the way unix filename wildcards
  work except that this first treats a wild card as a literal character
  when looking for a match.  If there is no literal match, then
  it interpretes it as a wild card.  So the template 'AB*DE'
  is considered to be an exact rather than a wild card match to
  the string 'AB*DE'.  The '#' wild card in the template string will 
  match any consecutive string of decimal digits in the colname.
  
*/
{
    int ii, found, t1, s1, wildsearch = 0, tsave = 0, ssave = 0;
    char temp[FLEN_VALUE], col[FLEN_VALUE];

    *match = FALSE;
    *exact = TRUE;

    strncpy(temp, templt, FLEN_VALUE); /* copy strings to work area */
    strncpy(col, colname, FLEN_VALUE);
    temp[FLEN_VALUE - 1] = '\0';  /* make sure strings are terminated */
    col[FLEN_VALUE - 1]  = '\0';

    /* truncate trailing non-significant blanks */
    for (ii = strlen(temp) - 1; ii >= 0 && temp[ii] == ' '; ii--)
        temp[ii] = '\0';

    for (ii = strlen(col) - 1; ii >= 0 && col[ii] == ' '; ii--)
        col[ii] = '\0';
       
    if (!casesen)
    {             /* convert both strings to uppercase before comparison */
        ffupch(temp);
        ffupch(col);
    }

    if (!FSTRCMP(temp, col) )
    {
        *match = TRUE;     /* strings exactly match */
        return;
    }

    *exact = FALSE;    /* strings don't exactly match */

    t1 = 0;   /* start comparison with 1st char of each string */
    s1 = 0;

    while(1)  /* compare corresponding chars in each string */
    {
      if (temp[t1] == '\0' && col[s1] == '\0')
      { 
         /* completely scanned both strings so they match */
         *match = TRUE;
         return;
      }
      else if (temp[t1] == '\0')
      { 
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
            /* reached end of template string so they don't match */
            return;
        }
      }
      else if (col[s1] == '\0')
      { 
         /* reached end of other string; they match if the next */
         /* character in the template string is a '*' wild card */

        if (temp[t1] == '*' && temp[t1 + 1] == '\0')
        {
           *match = TRUE;
        }

        return;
      }

      if (temp[t1] == col[s1] || (temp[t1] == '?') )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers and loop back again */
      }
      else if (temp[t1] == '#' && isdigit((int) col[s1]) )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers */

        /* find the end of the string of digits */
        while (isdigit((int) col[s1]) ) 
            s1++;        
      }
      else if (temp[t1] == '*')
      {

        /* save current string locations, in case we need to restart */
        wildsearch = 1;
        tsave = t1;
        ssave = s1;

        /* get next char from template and look for it in the col name */
        t1++;
        if (temp[t1] == '\0' || temp[t1] == ' ')
        {
          /* reached end of template so strings match */
          *match = TRUE;
          return;
        }

        found = FALSE;
        while (col[s1] && !found)
        {
          if (temp[t1] == col[s1])
          {
            t1++;  /* found matching characters; incre both pointers */
            s1++;  /* and loop back to compare next chars */
            found = TRUE;
          }
          else
            s1++;  /* increment the column name pointer and try again */
        }

        if (!found)
        {
          return;  /* hit end of column name and failed to find a match */
        }
      }
      else
      {
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
          return;   /* strings don't match */
        }
      }
    }
}